

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3PagerOpenSavepoint(Pager *pPager,int nSavepoint)

{
  u32 iSize;
  Wal *pWVar1;
  PagerSavepoint *pPVar2;
  ulong uVar3;
  Bitvec *pBVar4;
  int iVar5;
  long lVar6;
  u32 *puVar7;
  int iVar8;
  
  iVar8 = pPager->nSavepoint;
  lVar6 = (long)iVar8;
  iVar5 = 0;
  if ((iVar8 < nSavepoint) && (pPager->useJournal != '\0')) {
    pPVar2 = (PagerSavepoint *)sqlite3Realloc(pPager->aSavepoint,(long)nSavepoint * 0x30);
    iVar5 = 7;
    if (pPVar2 != (PagerSavepoint *)0x0) {
      memset(pPVar2 + lVar6,0,(long)(nSavepoint - iVar8) * 0x30);
      pPager->aSavepoint = pPVar2;
      puVar7 = pPVar2[lVar6].aWalData + 3;
      for (; iVar8 = iVar8 + 1, lVar6 < nSavepoint; lVar6 = lVar6 + 1) {
        iSize = pPager->dbSize;
        puVar7[-5] = iSize;
        if ((pPager->jfd->pMethods == (sqlite3_io_methods *)0x0) ||
           (uVar3 = pPager->journalOff, (long)uVar3 < 1)) {
          uVar3 = (ulong)pPager->sectorSize;
        }
        ((PagerSavepoint *)(puVar7 + -0xb))->iOffset = uVar3;
        puVar7[-4] = pPager->nSubRec;
        pBVar4 = sqlite3BitvecCreate(iSize);
        *(Bitvec **)(puVar7 + -7) = pBVar4;
        if (pBVar4 == (Bitvec *)0x0) {
          return 7;
        }
        pWVar1 = pPager->pWal;
        if (pWVar1 != (Wal *)0x0) {
          puVar7[-3] = (pWVar1->hdr).mxFrame;
          puVar7[-2] = (pWVar1->hdr).aFrameCksum[0];
          puVar7[-1] = (pWVar1->hdr).aFrameCksum[1];
          *puVar7 = pWVar1->nCkpt;
        }
        pPager->nSavepoint = iVar8;
        puVar7 = puVar7 + 0xc;
      }
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerOpenSavepoint(Pager *pPager, int nSavepoint){
  int rc = SQLITE_OK;                       /* Return code */
  int nCurrent = pPager->nSavepoint;        /* Current number of savepoints */

  assert( pPager->eState>=PAGER_WRITER_LOCKED );
  assert( assert_pager_state(pPager) );

  if( nSavepoint>nCurrent && pPager->useJournal ){
    int ii;                                 /* Iterator variable */
    PagerSavepoint *aNew;                   /* New Pager.aSavepoint array */

    /* Grow the Pager.aSavepoint array using realloc(). Return SQLITE_NOMEM
    ** if the allocation fails. Otherwise, zero the new portion in case a 
    ** malloc failure occurs while populating it in the for(...) loop below.
    */
    aNew = (PagerSavepoint *)sqlite3Realloc(
        pPager->aSavepoint, sizeof(PagerSavepoint)*nSavepoint
    );
    if( !aNew ){
      return SQLITE_NOMEM;
    }
    memset(&aNew[nCurrent], 0, (nSavepoint-nCurrent) * sizeof(PagerSavepoint));
    pPager->aSavepoint = aNew;

    /* Populate the PagerSavepoint structures just allocated. */
    for(ii=nCurrent; ii<nSavepoint; ii++){
      aNew[ii].nOrig = pPager->dbSize;
      if( isOpen(pPager->jfd) && pPager->journalOff>0 ){
        aNew[ii].iOffset = pPager->journalOff;
      }else{
        aNew[ii].iOffset = JOURNAL_HDR_SZ(pPager);
      }
      aNew[ii].iSubRec = pPager->nSubRec;
      aNew[ii].pInSavepoint = sqlite3BitvecCreate(pPager->dbSize);
      if( !aNew[ii].pInSavepoint ){
        return SQLITE_NOMEM;
      }
      if( pagerUseWal(pPager) ){
        sqlite3WalSavepoint(pPager->pWal, aNew[ii].aWalData);
      }
      pPager->nSavepoint = ii+1;
    }
    assert( pPager->nSavepoint==nSavepoint );
    assertTruncateConstraint(pPager);
  }

  return rc;
}